

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall
bloaty::RangeSink::AddFileRangeForVMAddr
          (RangeSink *this,char *analyzer,uint64_t label_from_vmaddr,string_view file_range)

{
  string_view format;
  bool bVar1;
  undefined1 uVar2;
  RangeMap *translator;
  const_pointer pvVar3;
  Arg *pAVar4;
  size_type sVar5;
  undefined8 uVar6;
  undefined8 in_RDX;
  Arg *in_RSI;
  string *in_RDI;
  string_view sVar7;
  bool ok;
  string label;
  pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *pair;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
  *__range1;
  bool verbose;
  uint64_t file_offset;
  DualMap *in_stack_fffffffffffffe38;
  Arg *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe48;
  Arg *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  undefined7 in_stack_fffffffffffffe68;
  Arg *in_stack_fffffffffffffe70;
  Arg *in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  Arg *size;
  uint64_t in_stack_fffffffffffffea8;
  RangeMap *in_stack_fffffffffffffeb0;
  RangeMap *in_stack_fffffffffffffec0;
  string local_b8 [35];
  undefined1 local_95;
  string local_88 [32];
  reference local_68;
  pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *local_60;
  __normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
  local_58;
  undefined1 *local_50;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  translator = (RangeMap *)std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
  sVar7 = InputFile::data(*(InputFile **)in_RDI);
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffc0);
  pAVar4 = (Arg *)((long)translator - (long)pvVar3);
  size = pAVar4;
  std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
  bVar1 = IsVerboseForFileRange
                    ((RangeSink *)sVar7._M_str,sVar7._M_len,
                     CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  if (bVar1) {
    in_stack_fffffffffffffe70 =
         (Arg *)GetDataSourceLabel((DataSource)((ulong)in_stack_fffffffffffffe40 >> 0x20));
    in_stack_fffffffffffffe88 = SUB87(pAVar4,0);
    in_stack_fffffffffffffe8f = (undefined1)((ulong)pAVar4 >> 0x38);
    in_stack_fffffffffffffe80 = in_RDX;
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
    printf("[%s, %s] AddFileRangeForVMAddr(%lx, [%lx, %zx])\n",in_stack_fffffffffffffe70,in_RSI,
           in_stack_fffffffffffffe80,CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
           sVar5);
    in_stack_fffffffffffffe78 = in_RSI;
  }
  if (in_RDI[7].field_2._M_allocated_capacity == 0) {
    __assert_fail("translator_",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                  0x4b7,
                  "void bloaty::RangeSink::AddFileRangeForVMAddr(const char *, uint64_t, string_view)"
                 );
  }
  local_50 = (undefined1 *)((long)&in_RDI[7].field_2 + 8);
  local_58._M_current =
       (pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *)
       std::
       vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
       ::begin((vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
                *)in_stack_fffffffffffffe38);
  local_60 = (pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *)
             std::
             vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
             ::end((vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
                    *)in_stack_fffffffffffffe38);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
                             *)in_stack_fffffffffffffe40,
                            (__normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
                             *)in_stack_fffffffffffffe38), bVar1) {
    local_68 = __gnu_cxx::
               __normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
               ::operator*(&local_58);
    std::__cxx11::string::string(local_88);
    uVar2 = RangeMap::TryGetLabel
                      ((RangeMap *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                       (uint64_t)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    if ((bool)uVar2) {
      in_stack_fffffffffffffe48 = (string *)&local_68->first->file_map;
      in_stack_fffffffffffffe50 = pAVar4;
      std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
      in_stack_fffffffffffffe38 = local_68->first;
      in_stack_fffffffffffffe5f =
           RangeMap::AddRangeWithTranslation
                     (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(uint64_t)size,in_RDI,
                      translator,(bool)in_stack_fffffffffffffe8f,in_stack_fffffffffffffec0);
      local_95 = in_stack_fffffffffffffe5f;
      if ((!(bool)in_stack_fffffffffffffe5f) && (0 < verbose_level)) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&in_stack_fffffffffffffe50->piece_,(char *)in_stack_fffffffffffffe48);
        absl::substitute_internal::Arg::Arg
                  (in_stack_fffffffffffffe50,(unsigned_long)in_stack_fffffffffffffe48);
        std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
        absl::substitute_internal::Arg::Arg
                  (in_stack_fffffffffffffe50,(unsigned_long)in_stack_fffffffffffffe48);
        in_stack_fffffffffffffe40 = (Arg *)&stack0xfffffffffffffea8;
        absl::substitute_internal::Arg::Arg<std::allocator<char>>
                  (in_stack_fffffffffffffe40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe38);
        format._M_str._0_7_ = in_stack_fffffffffffffe88;
        format._M_len = in_stack_fffffffffffffe80;
        format._M_str._7_1_ = in_stack_fffffffffffffe8f;
        absl::Substitute_abi_cxx11_
                  (format,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                   (Arg *)CONCAT17(uVar2,in_stack_fffffffffffffe68));
        uVar6 = std::__cxx11::string::c_str();
        printf("WARNING: %s\n",uVar6);
        std::__cxx11::string::~string(local_b8);
      }
    }
    else if (1 < verbose_level) {
      printf("No label found for vmaddr %lx\n",in_RDX);
    }
    std::__cxx11::string::~string(local_88);
    __gnu_cxx::
    __normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
    ::operator++(&local_58);
  }
  return;
}

Assistant:

void RangeSink::AddFileRangeForVMAddr(const char* analyzer,
                                      uint64_t label_from_vmaddr,
                                      string_view file_range) {
  uint64_t file_offset = file_range.data() - file_->data().data();
  bool verbose = IsVerboseForFileRange(file_offset, file_range.size());
  if (verbose) {
    printf("[%s, %s] AddFileRangeForVMAddr(%" PRIx64 ", [%" PRIx64 ", %zx])\n",
           GetDataSourceLabel(data_source_), analyzer, label_from_vmaddr,
           file_offset, file_range.size());
  }
  assert(translator_);
  for (auto& pair : outputs_) {
    std::string label;
    if (pair.first->vm_map.TryGetLabel(label_from_vmaddr, &label)) {
      bool ok = pair.first->file_map.AddRangeWithTranslation(
          file_offset, file_range.size(), label, translator_->file_map, verbose,
          &pair.first->vm_map);
      if (!ok) {
        WARN("File range ($0, $1) for label $2 extends beyond base map",
             file_offset, file_range.size(), label);
      }
    } else if (verbose_level > 1) {
      printf("No label found for vmaddr %" PRIx64 "\n", label_from_vmaddr);
    }
  }
}